

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

void __thiscall
CLIntercept::logFlushOrFinishAfterEnqueueEnd
          (CLIntercept *this,char *flushOrFinish,char *functionName,cl_int errorCode)

{
  CEnumNameMap *this_00;
  ostream *poVar1;
  ostream *__m;
  int in_ECX;
  char *in_RDX;
  char *in_RSI;
  CLIntercept *in_RDI;
  double __x;
  lock_guard<std::mutex> lock;
  ostringstream ss;
  ostringstream *this_01;
  cl_int e;
  string local_1f0 [40];
  string local_1c8 [48];
  ostringstream local_198 [380];
  int local_1c;
  char *local_18;
  char *local_10;
  
  this_01 = local_198;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::__cxx11::ostringstream::ostringstream(this_01);
  this_00 = (CEnumNameMap *)std::operator<<((ostream *)this_01,"... ");
  e = (cl_int)((ulong)this_01 >> 0x20);
  poVar1 = std::operator<<((ostream *)this_00,local_10);
  poVar1 = std::operator<<(poVar1," after ");
  poVar1 = std::operator<<(poVar1,local_18);
  poVar1 = std::operator<<(poVar1," returned ");
  enumName(in_RDI);
  CEnumNameMap::name_abi_cxx11_(this_00,e);
  poVar1 = std::operator<<(poVar1,local_1c8);
  poVar1 = std::operator<<(poVar1," (");
  __m = (ostream *)std::ostream::operator<<(poVar1,local_1c);
  std::operator<<(__m,")\n");
  std::__cxx11::string::~string(local_1c8);
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)poVar1,(mutex_type *)__m);
  __x = (double)std::__cxx11::ostringstream::str();
  log(in_RDI,__x);
  std::__cxx11::string::~string(local_1f0);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1f56c0);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return;
}

Assistant:

void CLIntercept::logFlushOrFinishAfterEnqueueEnd(
    const char* flushOrFinish,
    const char* functionName,
    cl_int errorCode )
{
    std::ostringstream  ss;
    ss << "... " << flushOrFinish << " after " << functionName << " returned " << enumName().name( errorCode ) << " (" << errorCode << ")\n";

    std::lock_guard<std::mutex> lock(m_Mutex);
    log( ss.str() );
}